

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9MultiProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  Abc_Frame_t *pAbc_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  Bmc_MulPar_t *pPars;
  Bmc_MulPar_t Pars;
  Vec_Int_t *vStatuses;
  Bmc_MulPar_t local_68;
  Abc_Frame_t *local_40;
  Vec_Int_t *local_38;
  
  local_68.fDumpFinal = 0;
  local_68.fVerbose = 0;
  local_68.fVeryVerbose = 0;
  local_68.TimeOutGlo = 0x1e;
  local_68.TimeOutLoc = 2;
  local_68.TimeOutInc = 100;
  local_68.TimeOutGap = 0;
  local_68.TimePerOut = 0;
  local_68.fUseSyn = 0;
  local_40 = pAbc;
  Extra_UtilGetoptReset();
LAB_0022dd6e:
  iVar1 = Extra_UtilGetopt(argc,argv,"TLMGHsdvwh");
  pAbc_00 = local_40;
  iVar3 = globalUtilOptind;
  if (0x53 < iVar1) {
    if (iVar1 < 0x73) {
      if (iVar1 == 0x54) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-T\" should be followed by an integer.\n";
          goto LAB_0022df29;
        }
        local_68.TimeOutGlo = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar3 + 1;
        if (local_68.TimeOutGlo < 0) goto switchD_0022ddbc_caseD_49;
        goto LAB_0022dd6e;
      }
      piVar4 = &local_68.fDumpFinal;
      if (iVar1 != 100) goto switchD_0022ddbc_caseD_49;
    }
    else {
      piVar4 = &local_68.fUseSyn;
      if ((iVar1 != 0x73) && (piVar4 = &local_68.fVerbose, iVar1 != 0x76)) {
        if (iVar1 != 0x77) goto switchD_0022ddbc_caseD_49;
        piVar4 = &local_68.fVeryVerbose;
      }
    }
    *(byte *)piVar4 = (byte)*piVar4 ^ 1;
    goto LAB_0022dd6e;
  }
  switch(iVar1) {
  case 0x47:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-G\" should be followed by an integer.\n";
      break;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_68.TimeOutGap = uVar2;
LAB_0022de47:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 1) {
switchD_0022ddbc_caseD_49:
      Abc_Print(-2,"usage: &mprove [-TLMGH num] [-sdvwh]\n");
      Abc_Print(-2,"\t         proves multi-output testcase by applying several engines\n");
      Abc_Print(-2,"\t-T num : approximate global runtime limit in seconds [default = %d]\n",
                (ulong)(uint)local_68.TimeOutGlo);
      Abc_Print(-2,"\t-L num : approximate local runtime limit in seconds [default = %d]\n",
                (ulong)(uint)local_68.TimeOutLoc);
      Abc_Print(-2,"\t-M num : percentage of local runtime limit increase [default = %d]\n",
                local_68._8_8_ & 0xffffffff);
      Abc_Print(-2,"\t-G num : approximate gap runtime limit in seconds [default = %d]\n",
                (ulong)local_68._8_8_ >> 0x20);
      Abc_Print(-2,"\t-H num : timeout per output in miliseconds [default = %d]\n",
                local_68._16_8_ & 0xffffffff);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_68.fUseSyn == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle using combinational synthesis [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_68.fDumpFinal == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle dumping invariant into a file [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_68.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      if (local_68.fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing additional verbose information [default = %s]\n",
                pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_0022e063:
      Abc_Print(iVar3,pcVar5);
      return 1;
    }
    goto LAB_0022dd6e;
  case 0x48:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_68.TimePerOut = uVar2;
      goto LAB_0022de47;
    }
    pcVar5 = "Command line switch \"-H\" should be followed by an integer.\n";
    break;
  case 0x49:
  case 0x4a:
  case 0x4b:
    goto switchD_0022ddbc_caseD_49;
  case 0x4c:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_68.TimeOutLoc = uVar2;
      goto LAB_0022de47;
    }
    pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x4d:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_68.TimeOutInc = uVar2;
      goto LAB_0022de47;
    }
    pcVar5 = "Command line switch \"-M\" should be followed by an integer.\n";
    break;
  default:
    if (iVar1 == -1) {
      p = local_40->pGia;
      if (p == (Gia_Man_t *)0x0) {
        pcVar5 = "Abc_CommandAbc9MultiProve(): There is no AIG.\n";
      }
      else {
        if (p->nRegs != 0) {
          iVar3 = Gia_ManMultiProve(p,&local_68);
          pAbc_00->Status = iVar3;
          local_38 = Abc_FrameDeriveStatusArray(pAbc_00->pGia->vSeqModelVec);
          Abc_FrameReplacePoStatuses(pAbc_00,&local_38);
          Abc_FrameReplaceCexVec(pAbc_00,&pAbc_00->pGia->vSeqModelVec);
          return 0;
        }
        pcVar5 = "Abc_CommandAbc9MultiProve(): The problem is combinational.\n";
      }
      iVar3 = -1;
      goto LAB_0022e063;
    }
    goto switchD_0022ddbc_caseD_49;
  }
LAB_0022df29:
  Abc_Print(-1,pcVar5);
  goto switchD_0022ddbc_caseD_49;
}

Assistant:

int Abc_CommandAbc9MultiProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_ManMultiProve( Gia_Man_t * p, Bmc_MulPar_t * pPars );
    Vec_Int_t * vStatuses; int c;
    Bmc_MulPar_t Pars, * pPars = &Pars;
    memset( pPars, 0, sizeof(Bmc_MulPar_t) );
    pPars->TimeOutGlo =  30;
    pPars->TimeOutLoc =   2;
    pPars->TimeOutInc = 100;
    pPars->TimeOutGap =   0;
    pPars->TimePerOut =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TLMGHsdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGlo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGlo < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutLoc = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutLoc <= 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutInc = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutInc <= 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGap <= 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimePerOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimePerOut <= 0 )
                goto usage;
            break;
        case 's':
            pPars->fUseSyn ^= 1;
            break;
        case 'd':
            pPars->fDumpFinal ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MultiProve(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9MultiProve(): The problem is combinational.\n" );
        return 1;
    }
    pAbc->Status = Gia_ManMultiProve( pAbc->pGia, pPars );
    vStatuses = Abc_FrameDeriveStatusArray( pAbc->pGia->vSeqModelVec );
    Abc_FrameReplacePoStatuses( pAbc, &vStatuses );        
    Abc_FrameReplaceCexVec( pAbc, &pAbc->pGia->vSeqModelVec );
    return 0;

usage:
    Abc_Print( -2, "usage: &mprove [-TLMGH num] [-sdvwh]\n" );
    Abc_Print( -2, "\t         proves multi-output testcase by applying several engines\n" );
    Abc_Print( -2, "\t-T num : approximate global runtime limit in seconds [default = %d]\n",     pPars->TimeOutGlo );
    Abc_Print( -2, "\t-L num : approximate local runtime limit in seconds [default = %d]\n",      pPars->TimeOutLoc );
    Abc_Print( -2, "\t-M num : percentage of local runtime limit increase [default = %d]\n",      pPars->TimeOutInc );
    Abc_Print( -2, "\t-G num : approximate gap runtime limit in seconds [default = %d]\n",        pPars->TimeOutGap );
    Abc_Print( -2, "\t-H num : timeout per output in miliseconds [default = %d]\n",               pPars->TimePerOut );
    Abc_Print( -2, "\t-s     : toggle using combinational synthesis [default = %s]\n",            pPars->fUseSyn?      "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dumping invariant into a file [default = %s]\n",            pPars->fDumpFinal?   "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",             pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional verbose information [default = %s]\n",  pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}